

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O2

hrgls_Status
hrgls_DataBlobSourceCreateParametersCreate(hrgls_DataBlobSourceCreateParams *returnParams)

{
  hrgls_DataBlobSourceCreateParams phVar1;
  
  phVar1 = (hrgls_DataBlobSourceCreateParams)operator_new(0x30);
  phVar1->api = (hrgls_API)0x0;
  phVar1->streamProperties = (hrgls_StreamProperties)0x0;
  (phVar1->name)._M_dataplus._M_p = (pointer)&(phVar1->name).field_2;
  (phVar1->name)._M_string_length = 0;
  (phVar1->name).field_2._M_local_buf[0] = '\0';
  *returnParams = phVar1;
  return 0;
}

Assistant:

hrgls_Status hrgls_DataBlobSourceCreateParametersCreate(
    hrgls_DataBlobSourceCreateParams *returnParams)
  {
    hrgls_Status s = hrgls_STATUS_OKAY;
    hrgls_DataBlobSourceCreateParams ret;
    try {
      ret = new hrgls_DataBlobSourceCreateParams_;
    } catch (...) {
      s = hrgls_STATUS_OUT_OF_MEMORY;
      ret = nullptr;
    }
    *returnParams = ret;
    return s;
  }